

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::append_copy(xml_node *this,xml_attribute *proto)

{
  xml_node_struct *pxVar1;
  xml_attribute xVar2;
  xml_attribute_struct *pxVar3;
  uint uVar4;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  if (((proto->_attr != (xml_attribute_struct *)0x0) &&
      (pxVar1 = this->_root, pxVar1 != (xml_node_struct *)0x0)) &&
     ((uVar4 = (uint)pxVar1->header & 0xf, uVar4 == 2 || (uVar4 == 7)))) {
    pxVar3 = impl::anon_unknown_0::allocate_attribute
                       (*(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8)));
    xml_attribute::xml_attribute(&local_20,pxVar3);
    if (local_20._attr != (xml_attribute_struct *)0x0) {
      xVar2._attr = this->_root->first_attribute;
      if (xVar2._attr == (xml_attribute_struct *)0x0) {
        this->_root->first_attribute = local_20._attr;
        xVar2._attr = local_20._attr;
      }
      else {
        pxVar3 = (xVar2._attr)->prev_attribute_c;
        pxVar3->next_attribute = local_20._attr;
        (local_20._attr)->prev_attribute_c = pxVar3;
      }
      (xVar2._attr)->prev_attribute_c = local_20._attr;
      impl::anon_unknown_0::node_copy_attribute(local_20._attr,proto->_attr);
      return (xml_attribute)local_20._attr;
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}